

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_table_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_table_verifier_f *tvf)

{
  int iVar1;
  void *pvVar2;
  flatbuffers_uoffset_t k;
  int iVar3;
  uint uVar4;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  flatbuffers_uoffset_t base;
  flatcc_table_verifier_descriptor_t local_68;
  ulong local_48;
  flatcc_table_verifier_f *local_40;
  uint local_34;
  ulong uVar5;
  
  iVar3 = get_offset_field(td,id,required,&local_34);
  if (local_34 != 0 && iVar3 == 0) {
    if (td->ttl < 1) {
LAB_00121a74:
      iVar3 = 3;
    }
    else {
      pvVar2 = td->buf;
      iVar7 = *(int *)((long)pvVar2 + (ulong)local_34);
      uVar6 = iVar7 + local_34;
      iVar3 = 0x10;
      if (local_34 < uVar6) {
        uVar4 = td->end;
        local_48 = (ulong)uVar4;
        if ((uVar6 & 3) == 0 && (ulong)uVar6 + 4 <= local_48) {
          uVar9 = *(uint *)((long)pvVar2 + (ulong)uVar6);
          if (uVar9 < 0x40000000 && (uVar6 & 3) == 0) {
            iVar3 = 0x1a;
            if (uVar9 * 4 <= (uVar4 - uVar6) - 4) {
              iVar3 = 0;
              if (uVar9 != 0) {
                iVar8 = td->ttl + -2;
                uVar6 = iVar7 + local_34;
                iVar7 = (uVar4 - iVar7) - local_34;
                local_40 = tvf;
                do {
                  iVar7 = iVar7 + -4;
                  uVar6 = uVar6 + 4;
                  iVar3 = *(int *)((long)pvVar2 + (ulong)uVar6);
                  if (iVar8 == 0) goto LAB_00121a74;
                  local_68.table = uVar6 + iVar3;
                  if (((local_68.table <= uVar6) || (local_48 < (ulong)local_68.table + 4)) ||
                     ((local_68.table & 3) != 0)) {
LAB_00121a92:
                    local_68.table = iVar3 + uVar6;
                    if (local_68.table <= uVar6) {
                      return 0xf;
                    }
                    if ((local_68.table & 3) != 0 || local_48 < (ulong)local_68.table + 4) {
                      return 0xf;
                    }
                    uVar6 = local_68.table - *(int *)((long)pvVar2 + (ulong)local_68.table);
                    uVar5 = (ulong)uVar6;
                    if ((uVar6 & 1) != 0 || (int)uVar6 < 0) {
                      return 0x1d;
                    }
                    if (local_48 < uVar5 + 2) {
                      return 0x1b;
                    }
                    local_68.vsize = *(ushort *)((long)pvVar2 + uVar5);
                    local_68.end = (flatbuffers_uoffset_t)local_48;
                    if ((local_68.vsize & 1) != 0 || local_68.end < uVar6 + local_68.vsize) {
                      return 0x1e;
                    }
                    if (local_68.vsize < 4) {
                      return 0x1c;
                    }
                    local_68.tsize = *(ushort *)((long)pvVar2 + uVar5 + 2);
                    if (local_68.end - local_68.table < (uint)local_68.tsize) {
                      return 0x14;
                    }
                    local_68.vtable = (void *)(uVar5 + (long)pvVar2);
                    local_68.buf = pvVar2;
                    local_68.ttl = iVar8;
                    iVar3 = (*local_40)(&local_68);
                    return iVar3;
                  }
                  iVar1 = *(int *)((long)pvVar2 + (ulong)local_68.table);
                  uVar4 = (iVar3 - iVar1) + uVar6;
                  uVar5 = (ulong)uVar4;
                  if ((((int)uVar4 < 0) || ((uVar4 & 1) != 0)) || (local_48 < uVar5 + 2))
                  goto LAB_00121a92;
                  local_68.vsize = *(ushort *)((long)pvVar2 + uVar5);
                  if (((local_68.vsize < 4) || ((local_68.vsize & 1) != 0)) ||
                     ((local_68.end = (flatbuffers_uoffset_t)local_48,
                      local_68.end < (((uint)local_68.vsize + iVar3) - iVar1) + uVar6 ||
                      (local_68.tsize = *(ushort *)((long)pvVar2 + uVar5 + 2),
                      (uint)(iVar7 - iVar3) < (uint)local_68.tsize)))) goto LAB_00121a92;
                  local_68.vtable = (void *)(uVar5 + (long)pvVar2);
                  local_68.buf = pvVar2;
                  local_68.ttl = iVar8;
                  iVar3 = (*local_40)(&local_68);
                  if (iVar3 != 0) {
                    iVar3 = *(int *)((long)pvVar2 + (ulong)uVar6);
                    goto LAB_00121a92;
                  }
                  uVar9 = uVar9 - 1;
                  iVar3 = 0;
                } while (uVar9 != 0);
              }
            }
          }
          else {
            iVar3 = (uint)((uVar6 & 3) == 0) * 9 + 0x10;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int flatcc_verify_table_vector_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_table_verifier_f tvf)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_table_vector(td->buf, td->end, base, read_uoffset(td->buf, base), td->ttl, tvf);
}